

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void uECC_vli_modMult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                     wordcount_t num_words)

{
  uECC_word_t *puVar1;
  uECC_word_t *puVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  short sVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  undefined7 in_register_00000081;
  ulong uVar11;
  char cVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  uECC_word_t mod_multiple [8];
  uECC_word_t product [8];
  uECC_word_t tmp [8];
  uECC_word_t *local_128 [4];
  ulong *local_108;
  ulong *local_100;
  ulong local_f8 [8];
  uECC_word_t local_b8 [8];
  uECC_word_t local_78 [9];
  
  iVar10 = (int)CONCAT71(in_register_00000081,num_words);
  local_128[3] = result;
  uECC_vli_mult(local_b8,left,right,num_words);
  local_128[0] = local_78;
  local_128[1] = local_b8;
  uVar5 = uECC_vli_numBits(mod,num_words);
  iVar16 = iVar10 * 0x80 - (uint)uVar5;
  uVar5 = (ushort)iVar16;
  uVar6 = uVar5 + 0x3f;
  if (-1 < (short)uVar5) {
    uVar6 = uVar5;
  }
  cVar3 = (char)((uint)(int)(short)uVar6 >> 6);
  sVar7 = uVar5 - (uVar6 & 0xffc0);
  if ('\0' < cVar3) {
    memset(local_f8,0,(ulong)(((uint)(int)(short)uVar6 >> 6 & 0x7f) << 3));
  }
  if (sVar7 < 1) {
    if ('\0' < num_words) {
      memcpy(local_f8 + cVar3,mod,(ulong)(byte)num_words << 3);
    }
  }
  else if (num_words != '\0') {
    bVar4 = (byte)sVar7;
    lVar9 = 0;
    uVar11 = 0;
    do {
      uVar13 = mod[lVar9] << (bVar4 & 0x3f) | uVar11;
      uVar11 = mod[lVar9] >> (0x40 - bVar4 & 0x3f);
      local_f8[cVar3 + lVar9] = uVar13;
      lVar9 = lVar9 + 1;
    } while (num_words != lVar9);
  }
  if ((short)uVar5 < 0) {
    uVar11 = 1;
  }
  else {
    local_108 = local_f8 + (byte)num_words;
    puVar8 = local_f8 + num_words;
    local_100 = puVar8 + (byte)num_words;
    uVar11 = 1;
    do {
      if (num_words < '\x01') {
        bVar19 = uVar11 == 0;
        local_f8[iVar10 + -1] = local_f8[iVar10 + -1] | *puVar8 << 0x3f;
      }
      else {
        puVar1 = local_128[uVar11];
        puVar2 = local_128[uVar11 ^ 1];
        iVar17 = 1;
        uVar13 = 0;
        do {
          cVar3 = (char)iVar17;
          cVar12 = cVar3 + -1;
          uVar18 = local_f8[cVar12] + uVar13;
          uVar14 = (ulong)(puVar1[cVar12] < uVar18);
          if (uVar18 == 0) {
            uVar14 = uVar13;
          }
          puVar2[cVar12] = puVar1[cVar12] - uVar18;
          iVar17 = cVar3 + 1;
          uVar13 = uVar14;
        } while ((int)cVar3 < iVar10 * 2);
        uVar13 = 0;
        puVar15 = local_108;
        do {
          uVar18 = puVar15[-1];
          puVar15[-1] = uVar18 >> 1 | uVar13;
          puVar15 = puVar15 + -1;
          uVar13 = uVar18 << 0x3f;
        } while (local_f8 < puVar15);
        local_f8[iVar10 + -1] = local_f8[iVar10 + -1] | *puVar8 << 0x3f;
        uVar13 = 0;
        puVar15 = local_100;
        do {
          uVar18 = puVar15[-1];
          puVar15[-1] = uVar18 >> 1 | uVar13;
          puVar15 = puVar15 + -1;
          uVar13 = uVar18 << 0x3f;
        } while (puVar8 < puVar15);
        bVar19 = uVar11 == uVar14;
      }
      uVar11 = (ulong)bVar19;
      sVar7 = (short)iVar16;
      iVar16 = iVar16 + -1;
    } while (0 < sVar7);
  }
  if ('\0' < num_words) {
    puVar1 = local_128[uVar11];
    uVar11 = 0;
    do {
      local_128[3][uVar11] = puVar1[uVar11];
      uVar11 = uVar11 + 1;
    } while ((byte)num_words != uVar11);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modMult(uECC_word_t *result,
                                   const uECC_word_t *left,
                                   const uECC_word_t *right,
                                   const uECC_word_t *mod,
                                   wordcount_t num_words) {
    uECC_word_t product[2 * uECC_MAX_WORDS];
    uECC_vli_mult(product, left, right, num_words);
    uECC_vli_mmod(result, product, mod, num_words);
}